

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall
cmDebugger_impl::OnWatchCallback
          (cmDebugger_impl *this,string *variable,int access_type,char *newValue)

{
  long *plVar1;
  _Base_ptr p_Var2;
  allocator local_61;
  cmDebugger_impl *local_60;
  char *local_58;
  string local_50 [32];
  
  if ((this->state)._M_i != Paused) {
    local_60 = this;
    local_58 = newValue;
    for (p_Var2 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      plVar1 = *(long **)(p_Var2 + 1);
      std::__cxx11::string::string(local_50,local_58,&local_61);
      (**(code **)(*plVar1 + 0x20))(plVar1,variable,access_type,local_50);
      std::__cxx11::string::~string(local_50);
    }
    PauseExecution(local_60);
  }
  return;
}

Assistant:

void OnWatchCallback(const std::string& variable, int access_type,
                       const char* newValue)
  {
    // It's possible that this is triggered by the user setting / reading the
    // variable via the debugger;
    // in which case we can't pause and shouldn't notify listeners.
    if (state != State::Paused) {
      for (auto& l : listeners) {
        l->OnWatchpoint(variable, access_type, newValue);
      }
      PauseExecution();
    }
  }